

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O3

bool chrono::utils::AddTriangleMeshConvexDecompositionSplit
               (ChSystem *system,shared_ptr<chrono::ChMaterialSurface> *material,
               string *obj_filename,string *name,ChVector<double> *pos,ChQuaternion<double> *rot,
               double total_mass)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _func_int *p_Var5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ChVisualModel *this;
  undefined8 this_00;
  char cVar12;
  int iVar13;
  int iVar14;
  _func_int **pp_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined4 extraout_var;
  double *pdVar16;
  ostream *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  ChTriangleMeshShape *this_03;
  long lVar18;
  shared_ptr<chrono::ChVisualModel> *model;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> convexhull;
  double mass;
  ChVector<double> center;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  ChConvexDecompositionHACDv2 mydecompositionHACDv2;
  ChMatrix33<double> inertia;
  ChTriangleMeshConnected trimesh_convex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_450;
  int local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_430;
  void *local_428;
  long lStack_420;
  long local_418;
  double local_408;
  ChSystem *local_400;
  ChTriangleMeshConnected *local_3f8;
  ChGeometry local_3f0;
  ChGeometry local_3e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3e0;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_3d8;
  shared_ptr<chrono::ChVisualModel> local_3c8;
  shared_ptr<chrono::ChVisualShape> local_3b8;
  element_type *local_3a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3a0;
  ChVector<double> local_398;
  double local_380;
  pointer local_378;
  _func_int **local_370;
  _func_int **local_368;
  double local_360;
  string *local_358;
  shared_ptr<chrono::ChMaterialSurface> *local_350;
  ChVisualModel *local_348;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_340;
  undefined1 local_338 [24];
  pointer local_320;
  ChVector<double> CStack_318;
  pointer local_300;
  pointer pCStack_2f8;
  pointer local_2f0;
  ChMatrix33<double> local_2e8;
  ChConvexDecompositionHACDv2 local_2a0;
  ChQuaternion<double> local_220;
  ChMatrix33<double> local_200;
  undefined1 local_1b8 [16];
  pointer pCStack_1a8;
  pointer pCStack_1a0;
  pointer pCStack_198;
  pointer pCStack_190;
  pointer pCStack_188;
  pointer pCStack_180;
  pointer pCStack_178;
  pointer local_170;
  pointer pCStack_168;
  pointer pCStack_160;
  pointer pCStack_158;
  pointer pCStack_150;
  pointer pCStack_148;
  pointer pCStack_140;
  pointer pCStack_138;
  pointer pCStack_130;
  pointer pCStack_128;
  pointer pCStack_120;
  pointer local_118;
  pointer pCStack_110;
  pointer pCStack_108;
  pointer pCStack_100;
  pointer pCStack_f8;
  pointer piStack_f0;
  pointer piStack_e8;
  pointer piStack_e0;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [9];
  
  local_360 = total_mass;
  local_358 = name;
  local_350 = material;
  iVar13 = (*((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->_vptr_ChMaterialSurface[3])();
  local_400 = system;
  iVar14 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                     (system);
  if (iVar13 != iVar14) {
    __assert_fail("material->GetContactMethod() == system->GetContactMethod()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChUtilsCreators.cpp"
                  ,399,
                  "bool chrono::utils::AddTriangleMeshConvexDecompositionSplit(ChSystem *, std::shared_ptr<ChMaterialSurface>, const std::string &, const std::string &, const ChVector<> &, const ChQuaternion<> &, double)"
                 );
  }
  bVar19 = false;
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)local_338,obj_filename,true,false);
  if ((ChTriangleMesh *)local_338._0_8_ != (ChTriangleMesh *)0x0) {
    pp_Var15 = (((ChTriangleMesh *)(local_338._0_8_ + 8))->super_ChGeometry)._vptr_ChGeometry;
    lVar18 = (long)(((ChTriangleMesh *)(local_338._0_8_ + 0x10))->super_ChGeometry)._vptr_ChGeometry
             - (long)pp_Var15;
    if (lVar18 != 0) {
      auVar20 = ZEXT816(0xbff0000000000000);
      auVar21 = ZEXT816(0x4000000000000000);
      lVar18 = (lVar18 >> 3) * -0x5555555555555555;
      lVar18 = lVar18 + (ulong)(lVar18 == 0);
      pp_Var15 = pp_Var15 + 2;
      do {
        dVar1 = rot->m_data[0];
        dVar2 = rot->m_data[2];
        dVar3 = rot->m_data[1];
        dVar4 = rot->m_data[3];
        p_Var5 = pp_Var15[-1];
        auVar32._8_8_ = 0;
        auVar32._0_8_ = pp_Var15[-2];
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *pp_Var15;
        dVar9 = dVar1 * dVar1;
        dVar10 = dVar3 * dVar2 - dVar4 * dVar1;
        dVar8 = dVar3 * dVar2 + dVar4 * dVar1;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar9 + dVar2 * dVar2;
        auVar27 = vfmadd213sd_fma(auVar29,auVar21,auVar20);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar9 + dVar3 * dVar3;
        auVar23 = vfmadd213sd_fma(auVar26,auVar21,auVar20);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = (double)p_Var5 * (dVar10 + dVar10);
        auVar23 = vfmadd231sd_fma(auVar31,auVar32,auVar23);
        dVar10 = dVar1 * dVar2 + dVar4 * dVar3;
        dVar11 = dVar4 * dVar3 - dVar1 * dVar2;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar8 + dVar8;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = (double)p_Var5 * auVar27._0_8_;
        auVar22 = vfmadd231sd_fma(auVar30,auVar32,auVar22);
        dVar8 = dVar4 * dVar2 - dVar1 * dVar3;
        dVar2 = dVar1 * dVar3 + dVar4 * dVar2;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar10 + dVar10;
        auVar27 = vfmadd213sd_fma(auVar27,auVar33,auVar23);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar8 + dVar8;
        auVar23 = vfmadd213sd_fma(auVar23,auVar33,auVar22);
        dVar1 = pos->m_data[1];
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar11 + dVar11;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = (double)p_Var5 * (dVar2 + dVar2);
        auVar24 = vfmadd231sd_fma(auVar28,auVar32,auVar24);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar4 * dVar4 + dVar9;
        auVar22 = vfmadd213sd_fma(auVar25,auVar21,auVar20);
        auVar22 = vfmadd213sd_fma(auVar22,auVar33,auVar24);
        dVar2 = pos->m_data[2];
        pp_Var15[-2] = (_func_int *)(auVar27._0_8_ + pos->m_data[0]);
        pp_Var15[-1] = (_func_int *)(auVar23._0_8_ + dVar1);
        *pp_Var15 = (_func_int *)(auVar22._0_8_ + dVar2);
        pp_Var15 = pp_Var15 + 3;
        lVar18 = lVar18 + -1;
      } while (lVar18 != 0);
    }
    collision::ChConvexDecompositionHACDv2::ChConvexDecompositionHACDv2(&local_2a0);
    collision::ChConvexDecompositionHACDv2::Reset(&local_2a0);
    collision::ChConvexDecompositionHACDv2::AddTriangleMesh
              (&local_2a0,(ChTriangleMesh *)local_338._0_8_);
    collision::ChConvexDecompositionHACDv2::SetParameters
              (&local_2a0,0x400,0x100,0x40,0.01,0.1,1e-06);
    collision::ChConvexDecompositionHACDv2::ComputeConvexDecomposition(&local_2a0);
    iVar13 = (*local_2a0.super_ChConvexDecomposition._vptr_ChConvexDecomposition[7])();
    local_398.m_data[2] = 0.0;
    local_398.m_data[0] = 0.0;
    local_398.m_data[1] = 0.0;
    if (iVar13 < 1) {
      bVar19 = true;
    }
    else {
      iVar14 = 0;
      local_450 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_3f0._vptr_ChGeometry = (_func_int **)&PTR__ChTriangleMeshConnected_00b3eaa8;
      do {
        local_d8._M_p = (pointer)local_c8;
        local_1b8._0_8_ = local_3f0._vptr_ChGeometry;
        piStack_f0 = (pointer)0x0;
        piStack_e8 = (pointer)0x0;
        piStack_e0 = (pointer)0x0;
        pCStack_130 = (pointer)0x0;
        pCStack_128 = (pointer)0x0;
        pCStack_120 = (pointer)0x0;
        local_118 = (pointer)0x0;
        pCStack_110 = (pointer)0x0;
        pCStack_108 = (pointer)0x0;
        pCStack_100 = (pointer)0x0;
        pCStack_f8 = (pointer)0x0;
        local_170 = (pointer)0x0;
        pCStack_168 = (pointer)0x0;
        pCStack_160 = (pointer)0x0;
        pCStack_158 = (pointer)0x0;
        pCStack_150 = (pointer)0x0;
        pCStack_148 = (pointer)0x0;
        pCStack_140 = (pointer)0x0;
        pCStack_138 = (pointer)0x0;
        local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pCStack_1a8 = (pointer)0x0;
        pCStack_1a0 = (pointer)0x0;
        pCStack_198 = (pointer)0x0;
        pCStack_190 = (pointer)0x0;
        pCStack_188 = (pointer)0x0;
        pCStack_180 = (pointer)0x0;
        pCStack_178 = (pointer)0x0;
        local_d0 = 0;
        local_c8[0]._M_local_buf[0] = '\0';
        cVar12 = (*local_2a0.super_ChConvexDecomposition._vptr_ChConvexDecomposition[8])
                           (&local_2a0,iVar14,(ChTriangleMeshConnected *)local_1b8);
        if (cVar12 == '\0') {
          geometry::ChTriangleMeshConnected::~ChTriangleMeshConnected
                    ((ChTriangleMeshConnected *)local_1b8);
          bVar19 = false;
          goto LAB_00912b36;
        }
        geometry::ChTriangleMeshConnected::ComputeMassProperties
                  ((ChTriangleMeshConnected *)local_1b8,true,&local_408,&local_398,&local_200);
        local_450 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((double)local_450 + local_408);
        geometry::ChTriangleMeshConnected::~ChTriangleMeshConnected
                  ((ChTriangleMeshConnected *)local_1b8);
        iVar14 = iVar14 + 1;
      } while (iVar13 != iVar14);
      bVar19 = false;
      local_448 = 0;
      local_380 = 1.0 / (double)local_450;
      local_368 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b3ebb8;
      local_370 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b0bf68;
      local_378 = (pointer)&PTR__ChFrame_00b03780;
      p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x110);
        this_01->_M_use_count = 1;
        this_01->_M_weak_count = 1;
        this_01->_vptr__Sp_counted_base = local_368;
        local_3f8 = (ChTriangleMeshConnected *)(this_01 + 1);
        this_01[1]._vptr__Sp_counted_base = local_3f0._vptr_ChGeometry;
        this_01[9]._M_use_count = 0;
        this_01[9]._M_weak_count = 0;
        this_01[10]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[10]._M_use_count = 0;
        this_01[10]._M_weak_count = 0;
        this_01[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[0xb]._M_use_count = 0;
        this_01[0xb]._M_weak_count = 0;
        this_01[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[0xc]._M_use_count = 0;
        this_01[0xc]._M_weak_count = 0;
        this_01[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[1]._M_use_count = 0;
        this_01[1]._M_weak_count = 0;
        this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[2]._M_use_count = 0;
        this_01[2]._M_weak_count = 0;
        this_01[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[3]._M_use_count = 0;
        this_01[3]._M_weak_count = 0;
        this_01[4]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[4]._M_use_count = 0;
        this_01[4]._M_weak_count = 0;
        this_01[5]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[5]._M_use_count = 0;
        this_01[5]._M_weak_count = 0;
        this_01[6]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[6]._M_use_count = 0;
        this_01[6]._M_weak_count = 0;
        this_01[7]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[7]._M_use_count = 0;
        this_01[7]._M_weak_count = 0;
        this_01[8]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[8]._M_use_count = 0;
        this_01[8]._M_weak_count = 0;
        this_01[9]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[0xb]._M_use_count = 0;
        this_01[0xb]._M_weak_count = 0;
        this_01[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[0xc]._M_use_count = 0;
        this_01[0xc]._M_weak_count = 0;
        this_01[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[0xd]._M_use_count = 0;
        this_01[0xd]._M_weak_count = 0;
        this_01[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_01[0xe]._M_use_count = 0;
        this_01[0xe]._M_weak_count = 0;
        this_01[0xf]._vptr__Sp_counted_base = (_func_int **)(this_01 + 0x10);
        this_01[0xf]._M_use_count = 0;
        this_01[0xf]._M_weak_count = 0;
        *(undefined1 *)&this_01[0x10]._vptr__Sp_counted_base = 0;
        cVar12 = (*local_2a0.super_ChConvexDecomposition._vptr_ChConvexDecomposition[8])
                           (&local_2a0,local_448);
        local_450 = p_Var17;
        if (cVar12 == '\0') {
LAB_00912b1a:
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          break;
        }
        geometry::ChTriangleMeshConnected::ComputeMassProperties
                  (local_3f8,true,&local_408,&local_398,&local_200);
        local_1b8._0_4_ =
             (*(local_400->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x30])()
        ;
        local_1b8._4_4_ = extraout_var;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),
                   (ChBody *)local_1b8._0_8_);
        local_450 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
        this_00 = local_1b8._0_8_;
        local_1b8._0_8_ = (_func_int **)0x0;
        local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
        }
        ChVariablesBodyOwnMass::SetBodyMass((ChVariablesBodyOwnMass *)(this_00 + 0x260),local_408);
        if ((ChCoordsys<double> *)(this_00 + 0x80) != (ChCoordsys<double> *)pos) {
          (((ChCoordsys<double> *)(this_00 + 0x80))->pos).m_data[0] = pos->m_data[0];
          *(double *)(this_00 + 0x88) = pos->m_data[1];
          *(double *)(this_00 + 0x90) = pos->m_data[2];
        }
        ChFrame<double>::SetRot((ChFrame<double> *)(this_00 + 0x78),rot);
        ChBody::SetCollide((ChBody *)this_00,true);
        ChBody::SetBodyFixed((ChBody *)this_00,false);
        local_418 = 0;
        local_428 = (void *)0x0;
        lStack_420 = 0;
        cVar12 = (**(code **)((pointer)
                             (local_2a0.super_ChConvexDecomposition._vptr_ChConvexDecomposition + 9)
                             )->m_data)(&local_2a0,local_448,&local_428);
        if (cVar12 == '\0') {
          if (local_428 != (void *)0x0) {
            operator_delete(local_428,local_418 - (long)local_428);
          }
          goto LAB_00912b1a;
        }
        if (lStack_420 - (long)local_428 != 0) {
          lVar18 = (lStack_420 - (long)local_428 >> 3) * -0x5555555555555555;
          lVar18 = lVar18 + (ulong)(lVar18 == 0);
          pdVar16 = (double *)((long)local_428 + 0x10);
          do {
            auVar20._8_8_ = local_398.m_data[1];
            auVar20._0_8_ = local_398.m_data[0];
            auVar20 = vsubpd_avx(*(undefined1 (*) [16])(pdVar16 + -2),auVar20);
            *(undefined1 (*) [16])(pdVar16 + -2) = auVar20;
            *pdVar16 = *pdVar16 - local_398.m_data[2];
            pdVar16 = pdVar16 + 3;
            lVar18 = lVar18 + -1;
          } while (lVar18 != 0);
        }
        peVar6 = (((shared_ptr<chrono::collision::ChCollisionModel> *)(this_00 + 0x198))->
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        p_Var17 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x1a0))->_M_pi;
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          }
        }
        (*peVar6->_vptr_ChCollisionModel[3])();
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
        }
        peVar6 = (((shared_ptr<chrono::collision::ChCollisionModel> *)(this_00 + 0x198))->
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        p_Var17 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x1a0))->_M_pi;
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          }
        }
        local_3a8 = (local_350->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
        p_Stack_3a0 = (local_350->
                      super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
        p_Var7 = (local_350->
                 super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
        ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_1b8,rot);
        (*peVar6->_vptr_ChCollisionModel[0xf])
                  (peVar6,&local_3a8,&local_428,pos,(ChMatrix33<double> *)local_1b8);
        if (p_Stack_3a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_3a0);
        }
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
        }
        peVar6 = (((shared_ptr<chrono::collision::ChCollisionModel> *)(this_00 + 0x198))->
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        p_Var17 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x1a0))->_M_pi;
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          }
        }
        (*peVar6->_vptr_ChCollisionModel[4])();
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        this_02 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pCStack_1a8,(local_358->_M_dataplus)._M_p,
                             local_358->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(this_02,"_",1);
        std::ostream::operator<<(this_02,local_448);
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
        p_Var17->_M_use_count = 1;
        p_Var17->_M_weak_count = 1;
        local_3c8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(p_Var17 + 1);
        p_Var17->_vptr__Sp_counted_base = local_370;
        p_Var17[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var17[1]._M_use_count = 0;
        p_Var17[1]._M_weak_count = 0;
        p_Var17[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var17[2]._M_use_count = 0;
        p_Var17[2]._M_weak_count = 0;
        p_Var17[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var17[2]._M_use_count = 0;
        p_Var17[2]._M_weak_count = 0;
        p_Var17[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var17[3]._M_use_count = 0;
        p_Var17[3]._M_weak_count = 0;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var17->_M_use_count = 2;
        }
        model = &local_3c8;
        local_3c8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var17;
        ChPhysicsItem::AddVisualModel((ChPhysicsItem *)this_00,model);
        if (local_3c8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3c8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        this_03 = (ChTriangleMeshShape *)
                  ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)model);
        ChTriangleMeshShape::ChTriangleMeshShape(this_03);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::ChTriangleMeshShape*>(&_Stack_430,this_03);
        local_3d8.
        super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_3f8;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
        local_3d8.
        super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = this_01;
        ChTriangleMeshShape::SetMesh(this_03,&local_3d8,true);
        if (local_3d8.
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3d8.
                     super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&this_03->name);
        if ((ChVector<double> *)local_338._16_8_ != &CStack_318) {
          operator_delete((void *)local_338._16_8_,(ulong)((long)(double *)CStack_318.m_data[0] + 1)
                         );
        }
        ChPhysicsItem::GetVisualModel((ChPhysicsItem *)this_00);
        this = local_348;
        local_3b8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_430._M_pi;
        if (_Stack_430._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (_Stack_430._M_pi)->_M_use_count = (_Stack_430._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (_Stack_430._M_pi)->_M_use_count = (_Stack_430._M_pi)->_M_use_count + 1;
          }
        }
        local_220.m_data[0] = 1.0;
        local_220.m_data[3] = 0.0;
        local_220.m_data[1] = 0.0;
        local_220.m_data[2] = 0.0;
        local_338._16_8_ = local_378;
        CStack_318.m_data[1] = 0.0;
        local_320 = (pointer)0x0;
        CStack_318.m_data[0] = 0.0;
        CStack_318.m_data[2] = 1.0;
        local_2f0 = (pointer)0x0;
        local_300 = (pointer)0x0;
        pCStack_2f8 = (pointer)0x0;
        local_3b8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this_03;
        ChMatrix33<double>::ChMatrix33(&local_2e8,&local_220);
        ChVisualModel::AddShape(this,&local_3b8,(ChFrame<double> *)(local_338 + 0x10));
        if (local_3b8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3b8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_340 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_340);
        }
        local_338._16_8_ =
             local_380 *
             local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
             * local_360;
        local_320 = (pointer)(local_380 *
                              local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[4] * local_360);
        CStack_318.m_data[0] =
             local_380 *
             local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
             * local_360;
        ChBody::SetInertiaXX((ChBody *)this_00,(ChVector<double> *)(local_338 + 0x10));
        local_3e8._vptr_ChGeometry = (_func_int **)this_00;
        local_3e0 = local_450;
        if (local_450 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)((long)local_450 + 8) = *(_Atomic_word *)((long)local_450 + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)((long)local_450 + 8) = *(_Atomic_word *)((long)local_450 + 8) + 1;
          }
        }
        (*(local_400->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])
                  (local_400,&local_3e8);
        if (local_3e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e0);
        }
        if (_Stack_430._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_430._M_pi);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base((ios_base *)&pCStack_138);
        if (local_428 != (void *)0x0) {
          operator_delete(local_428,local_418 - (long)local_428);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        local_448 = local_448 + 1;
        bVar19 = iVar13 <= local_448;
        p_Var17 = local_450;
      } while (local_448 != iVar13);
      if (local_450 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450);
      }
    }
LAB_00912b36:
    collision::ChConvexDecompositionHACDv2::~ChConvexDecompositionHACDv2(&local_2a0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
  }
  return bVar19;
}

Assistant:

bool AddTriangleMeshConvexDecompositionSplit(ChSystem* system,
                                             std::shared_ptr<ChMaterialSurface> material,
                                             const std::string& obj_filename,
                                             const std::string& name,
                                             const ChVector<>& pos,
                                             const ChQuaternion<>& rot,
                                             double total_mass) {
    assert(material->GetContactMethod() == system->GetContactMethod());

    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(obj_filename, true, false);
    if (!trimesh)
        return false;

    for (int i = 0; i < trimesh->m_vertices.size(); i++) {
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);
    }
    collision::ChConvexDecompositionHACDv2 mydecompositionHACDv2;

    int hacd_maxhullcount = 1024;
    int hacd_maxhullmerge = 256;
    int hacd_maxhullvertexes = 64;
    double hacd_concavity = 0.01;
    double hacd_smallclusterthreshold = 0.1;
    double hacd_fusetolerance = 1e-6;

    mydecompositionHACDv2.Reset();
    mydecompositionHACDv2.AddTriangleMesh(*trimesh);

    mydecompositionHACDv2.SetParameters(hacd_maxhullcount, hacd_maxhullmerge, hacd_maxhullvertexes,
                                        (float)hacd_concavity, (float)hacd_smallclusterthreshold,
                                        (float)hacd_fusetolerance);
    mydecompositionHACDv2.ComputeConvexDecomposition();
    collision::ChConvexDecomposition* used_decomposition = &mydecompositionHACDv2;

    int hull_count = used_decomposition->GetHullCount();

    std::shared_ptr<ChBody> body;
    double mass;
    ChVector<> center;
    ChMatrix33<> inertia;
    double sum = 0;
    for (int c = 0; c < hull_count; c++) {
        geometry::ChTriangleMeshConnected trimesh_convex;
        if (!used_decomposition->GetConvexHullResult(c, trimesh_convex))
            return false;
        trimesh_convex.ComputeMassProperties(true, mass, center, inertia);
        sum += mass;
    }

    double scale = 1.0 / sum;

    for (int c = 0; c < hull_count; c++) {
        auto trimesh_convex = chrono_types::make_shared<geometry::ChTriangleMeshConnected>();
        if (!used_decomposition->GetConvexHullResult(c, *trimesh_convex))
            return false;
        trimesh_convex->ComputeMassProperties(true, mass, center, inertia);

        body = std::shared_ptr<ChBody>(system->NewBody());
        body->SetMass(mass);
        body->SetPos(pos);
        body->SetRot(rot);
        body->SetCollide(true);
        body->SetBodyFixed(false);

        std::vector<ChVector<double>> convexhull;
        if (!used_decomposition->GetConvexHullResult(c, convexhull))
            return false;
        for (size_t v = 0; v < convexhull.size(); v++) {
            convexhull[v] = convexhull[v] - center;
        }

        body->GetCollisionModel()->ClearModel();
        body->GetCollisionModel()->AddConvexHull(material, convexhull, pos, rot);
        body->GetCollisionModel()->BuildModel();

        std::stringstream ss;
        ss << name << "_" << c;
        //      geometry::ChTriangleMeshConnected trimesh_convex;
        //      used_decomposition->GetConvexHullResult(c, trimesh_convex);

        auto model = chrono_types::make_shared<ChVisualModel>();
        body->AddVisualModel(model);

        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh_convex);
        trimesh_shape->SetName(ss.str());
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());

        // std::cout << mass << " " << scale * mass* total_mass << " " <<
        // inertia(0, 0) << " " << inertia(1, 1) << " " << inertia(2, 2) << std::endl;
        body->SetInertiaXX(ChVector<>(inertia(0, 0) * scale * total_mass, inertia(1, 1) * scale * total_mass,
                                      inertia(2, 2) * scale * total_mass));

        system->AddBody(body);
    }

    return true;
}